

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O0

void __thiscall
Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>::gemm_blocking_space
          (gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> *this,Index rows,Index cols,
          Index depth,Index num_threads,bool l3_blocking)

{
  byte bVar1;
  Index in_RCX;
  Index in_RDX;
  Index in_RSI;
  level3_blocking<double,_double> *in_RDI;
  byte in_R9B;
  Index n;
  long in_stack_ffffffffffffffb8;
  long *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  
  bVar1 = in_R9B & 1;
  level3_blocking<double,_double>::level3_blocking(in_RDI);
  in_RDI->m_mc = in_RSI;
  in_RDI->m_nc = in_RDX;
  in_RDI->m_kc = in_RCX;
  if ((bVar1 & 1) == 0) {
    computeProductBlockingSizes<double,double,1,long>
              ((long *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),(long *)in_RDI->m_nc,(long *)in_RDI
               ,in_stack_ffffffffffffffb8);
  }
  else {
    computeProductBlockingSizes<double,double,1,long>
              ((long *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
               (long *)in_RDI,in_stack_ffffffffffffffb8);
  }
  in_RDI[1].m_blockA = (LhsScalar *)(in_RDI->m_mc * in_RDI->m_kc);
  in_RDI[1].m_blockB = (RhsScalar *)(in_RDI->m_kc * in_RDI->m_nc);
  return;
}

Assistant:

gemm_blocking_space(Index rows, Index cols, Index depth, Index num_threads, bool l3_blocking)
    {
      this->m_mc = Transpose ? cols : rows;
      this->m_nc = Transpose ? rows : cols;
      this->m_kc = depth;

      if(l3_blocking)
      {
        computeProductBlockingSizes<LhsScalar,RhsScalar,KcFactor>(this->m_kc, this->m_mc, this->m_nc, num_threads);
      }
      else  // no l3 blocking
      {
        Index n = this->m_nc;
        computeProductBlockingSizes<LhsScalar,RhsScalar,KcFactor>(this->m_kc, this->m_mc, n, num_threads);
      }

      m_sizeA = this->m_mc * this->m_kc;
      m_sizeB = this->m_kc * this->m_nc;
    }